

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
* __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
::child(btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
        *this,size_type i)

{
  template_ElementType<3UL> *ppbVar1;
  size_type i_local;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_true>_>
  *this_local;
  
  ppbVar1 = btree_node<phmap::priv::map_params<std::__cxx11::string,int,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,true>>
            ::GetField<3ul>((btree_node<phmap::priv::map_params<std::__cxx11::string,int,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,true>>
                             *)this);
  return ppbVar1[i];
}

Assistant:

btree_node *child(size_type i) const { return GetField<3>()[i]; }